

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void color_cmyk_to_rgb(opj_image_t *image)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  int iVar5;
  opj_image_comp_t *poVar6;
  OPJ_INT32 *pOVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  long lVar20;
  OPJ_INT32 *pOVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  
  if (3 < image->numcomps) {
    poVar6 = image->comps;
    OVar3 = poVar6->dx;
    if ((((OVar3 == poVar6[1].dx) && (OVar3 == poVar6[2].dx)) && (OVar3 == poVar6[3].dx)) &&
       (((OVar3 = poVar6->dy, OVar3 == poVar6[1].dy && (OVar3 == poVar6[2].dy)) &&
        (OVar3 == poVar6[3].dy)))) {
      OVar3 = poVar6->prec;
      OVar17 = poVar6[1].prec;
      uVar22 = poVar6->w * poVar6->h;
      OVar18 = poVar6[2].prec;
      OVar19 = poVar6[3].prec;
      if (uVar22 == 0) {
        pOVar21 = poVar6[3].data;
      }
      else {
        pOVar7 = poVar6->data;
        pOVar8 = poVar6[1].data;
        pOVar9 = poVar6[2].data;
        pOVar21 = poVar6[3].data;
        uVar23 = 0;
        do {
          iVar4 = pOVar8[uVar23];
          iVar5 = pOVar9[uVar23];
          fVar24 = 1.0 - (float)pOVar21[uVar23] * (1.0 / (float)~(-1 << ((byte)OVar19 & 0x1f)));
          pOVar7[uVar23] =
               (int)((1.0 - (float)pOVar7[uVar23] * (1.0 / (float)~(-1 << ((byte)OVar3 & 0x1f)))) *
                     255.0 * fVar24);
          pOVar8[uVar23] =
               (int)((1.0 - (float)iVar4 * (1.0 / (float)~(-1 << ((byte)OVar17 & 0x1f)))) * 255.0 *
                    fVar24);
          pOVar9[uVar23] =
               (int)((1.0 - (float)iVar5 * (1.0 / (float)~(-1 << ((byte)OVar18 & 0x1f)))) * 255.0 *
                    fVar24);
          uVar23 = uVar23 + 1;
        } while (uVar22 != uVar23);
      }
      opj_image_data_free(pOVar21);
      poVar6 = image->comps;
      poVar6[3].data = (OPJ_INT32 *)0x0;
      poVar6->prec = 8;
      poVar6[1].prec = 8;
      poVar6[2].prec = 8;
      uVar22 = image->numcomps - 1;
      image->numcomps = uVar22;
      image->color_space = OPJ_CLRSPC_SRGB;
      if (uVar22 < 4) {
        return;
      }
      uVar23 = 3;
      lVar20 = 0x100;
      do {
        poVar6 = image->comps;
        uVar23 = uVar23 + 1;
        puVar2 = (undefined8 *)((long)&poVar6->dx + lVar20);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar6->x0 + lVar20);
        uVar12 = *puVar2;
        uVar13 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar6->sgnd + lVar20);
        uVar14 = *puVar2;
        uVar15 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar6->data + lVar20);
        uVar16 = puVar2[1];
        puVar1 = (undefined8 *)((long)poVar6 + lVar20 + -0x10);
        *puVar1 = *puVar2;
        puVar1[1] = uVar16;
        puVar2 = (undefined8 *)((long)poVar6 + lVar20 + -0x20);
        *puVar2 = uVar14;
        puVar2[1] = uVar15;
        puVar2 = (undefined8 *)((long)poVar6 + lVar20 + -0x30);
        *puVar2 = uVar12;
        puVar2[1] = uVar13;
        puVar2 = (undefined8 *)((long)&poVar6[-1].dx + lVar20);
        *puVar2 = uVar10;
        puVar2[1] = uVar11;
        lVar20 = lVar20 + 0x40;
      } while (uVar23 < image->numcomps);
      return;
    }
  }
  color_cmyk_to_rgb_cold_1();
  return;
}

Assistant:

void color_cmyk_to_rgb(opj_image_t *image)
{
    float C, M, Y, K;
    float sC, sM, sY, sK;
    unsigned int w, h, max, i;

    w = image->comps[0].w;
    h = image->comps[0].h;

    if (
        (image->numcomps < 4)
        || (image->comps[0].dx != image->comps[1].dx) ||
        (image->comps[0].dx != image->comps[2].dx) ||
        (image->comps[0].dx != image->comps[3].dx)
        || (image->comps[0].dy != image->comps[1].dy) ||
        (image->comps[0].dy != image->comps[2].dy) ||
        (image->comps[0].dy != image->comps[3].dy)
    ) {
        fprintf(stderr, "%s:%d:color_cmyk_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }

    max = w * h;

    sC = 1.0F / (float)((1 << image->comps[0].prec) - 1);
    sM = 1.0F / (float)((1 << image->comps[1].prec) - 1);
    sY = 1.0F / (float)((1 << image->comps[2].prec) - 1);
    sK = 1.0F / (float)((1 << image->comps[3].prec) - 1);

    for (i = 0; i < max; ++i) {
        /* CMYK values from 0 to 1 */
        C = (float)(image->comps[0].data[i]) * sC;
        M = (float)(image->comps[1].data[i]) * sM;
        Y = (float)(image->comps[2].data[i]) * sY;
        K = (float)(image->comps[3].data[i]) * sK;

        /* Invert all CMYK values */
        C = 1.0F - C;
        M = 1.0F - M;
        Y = 1.0F - Y;
        K = 1.0F - K;

        /* CMYK -> RGB : RGB results from 0 to 255 */
        image->comps[0].data[i] = (int)(255.0F * C * K); /* R */
        image->comps[1].data[i] = (int)(255.0F * M * K); /* G */
        image->comps[2].data[i] = (int)(255.0F * Y * K); /* B */
    }

    opj_image_data_free(image->comps[3].data);
    image->comps[3].data = NULL;
    image->comps[0].prec = 8;
    image->comps[1].prec = 8;
    image->comps[2].prec = 8;
    image->numcomps -= 1;
    image->color_space = OPJ_CLRSPC_SRGB;

    for (i = 3; i < image->numcomps; ++i) {
        memcpy(&(image->comps[i]), &(image->comps[i + 1]), sizeof(image->comps[i]));
    }

}